

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  ulong uVar1;
  uint uVar2;
  u8 *puVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  ulong uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  uint uVar12;
  undefined6 in_register_00000012;
  ulong uVar13;
  undefined6 in_register_00000032;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  int local_54;
  ushort local_50;
  
  uVar10 = (uint)CONCAT62(in_register_00000032,iStart);
  uVar15 = CONCAT62(in_register_00000032,iStart) & 0xffffffff;
  iVar4 = (int)CONCAT62(in_register_00000012,iSize);
  uVar12 = iVar4 + uVar10;
  puVar3 = pPage->aData;
  uVar13 = (ulong)pPage->hdrOffset;
  uVar1 = uVar13 + 1;
  uVar7 = uVar1;
  local_54 = iVar4;
  if ((puVar3[uVar13 + 2] == '\0') && (puVar3[uVar1] == '\0')) {
    local_50 = 0;
    uVar16 = uVar1;
  }
  else {
    do {
      uVar16 = uVar7;
      uVar8 = *(ushort *)(puVar3 + uVar16);
      local_50 = uVar8 << 8 | uVar8 >> 8;
      uVar7 = (ulong)local_50;
      uVar9 = (uint)local_50;
      uVar5 = (uint)uVar16;
      if ((ushort)uVar15 <= local_50) goto LAB_00149fc9;
    } while (uVar5 + 4 <= uVar9);
    if (local_50 != 0) {
      uVar11 = 0x10c4c;
      goto LAB_00149ffb;
    }
LAB_00149fc9:
    uVar2 = pPage->pBt->usableSize;
    if (uVar2 - 4 < uVar9) {
      uVar11 = 0x10c51;
      goto LAB_00149ffb;
    }
    if (uVar12 + 3 < uVar9 || local_50 == 0) {
      bVar14 = 0;
    }
    else {
      bVar14 = (char)(uVar8 >> 8) - (char)uVar12;
      if (local_50 < uVar12) {
        uVar11 = 0x10c5d;
        goto LAB_00149ffb;
      }
      uVar12 = (ushort)(*(ushort *)(puVar3 + uVar7 + 2) << 8 | *(ushort *)(puVar3 + uVar7 + 2) >> 8)
               + uVar9;
      if (uVar2 < uVar12) {
        uVar11 = 0x10c60;
        goto LAB_00149ffb;
      }
      local_54 = uVar12 - uVar10;
      local_50 = *(ushort *)(puVar3 + uVar7) << 8 | *(ushort *)(puVar3 + uVar7) >> 8;
    }
    if ((uint)uVar1 < uVar5) {
      uVar8 = *(ushort *)(puVar3 + uVar16 + 2) << 8 | *(ushort *)(puVar3 + uVar16 + 2) >> 8;
      bVar6 = true;
      if (uVar10 <= uVar8 + uVar5 + 3) {
        uVar9 = uVar8 + uVar5;
        if (uVar10 < uVar9) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10c6d,
                      "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
          bVar6 = false;
        }
        else {
          bVar14 = bVar14 + ((char)iStart - (char)uVar9);
          local_54 = uVar12 - uVar5;
          uVar15 = uVar16;
          bVar6 = true;
        }
      }
      if (!bVar6) {
        return 0xb;
      }
    }
    if (puVar3[uVar13 + 7] < bVar14) {
      uVar11 = 0x10c73;
      goto LAB_00149ffb;
    }
    puVar3[uVar13 + 7] = puVar3[uVar13 + 7] - bVar14;
  }
  uVar7 = uVar15 & 0xffff;
  uVar10 = (uint)(ushort)(*(ushort *)(puVar3 + uVar13 + 5) << 8 |
                         *(ushort *)(puVar3 + uVar13 + 5) >> 8);
  if ((uint)uVar7 <= uVar10) {
    if ((uint)uVar7 < uVar10) {
      uVar11 = 0x10c7c;
    }
    else {
      if ((uint)uVar1 == (uint)uVar16) {
        *(ushort *)(puVar3 + uVar1) = local_50 << 8 | local_50 >> 8;
        puVar3[uVar13 + 5] = (u8)(uVar12 >> 8);
        puVar3[uVar13 + 6] = (u8)uVar12;
        goto LAB_0014a1e6;
      }
      uVar11 = 0x10c7d;
    }
LAB_00149ffb:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar11,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    return 0xb;
  }
  *(ushort *)(puVar3 + uVar16) = (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
LAB_0014a1e6:
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar3 + uVar7,0,(ulong)(ushort)local_54);
  }
  puVar3[uVar7] = (u8)(local_50 >> 8);
  puVar3[uVar7 + 1] = (u8)local_50;
  puVar3[uVar7 + 2] = (u8)((uint)local_54 >> 8);
  puVar3[uVar7 + 3] = (u8)local_54;
  pPage->nFree = pPage->nFree + iVar4;
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */
  u8 *pTmp;                             /* Temporary ptr into data[] */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<iPtr+4 ){
        if( iFreeBlk==0 ) break; /* TH3: corrupt082.100 */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){ /* TH3: corrupt081.100 */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 || CORRUPT_DB );

    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }

    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  pTmp = &data[hdr+5];
  x = get2byte(pTmp);
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
  }
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  put2byte(&data[iStart], iFreeBlk);
  put2byte(&data[iStart+2], iSize);
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}